

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::makeStatementTerminator(Builder *this,Op opcode,char *name)

{
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  char *local_20;
  char *name_local;
  Builder *pBStack_10;
  Op opcode_local;
  Builder *this_local;
  
  local_20 = name;
  name_local._4_4_ = opcode;
  pBStack_10 = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,name_local._4_4_);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,this_00
            );
  addInstruction(this,&local_28);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  createAndSetNoPredecessorBlock(this,local_20);
  return;
}

Assistant:

void Builder::makeStatementTerminator(spv::Op opcode, const char *name)
{
    addInstruction(std::unique_ptr<Instruction>(new Instruction(opcode)));
    createAndSetNoPredecessorBlock(name);
}